

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log_test.cc
# Opt level: O0

void __thiscall leveldb::log::LogTest::ReportCollector::~ReportCollector(ReportCollector *this)

{
  ReportCollector *this_local;
  
  (this->super_Reporter)._vptr_Reporter = (_func_int **)&PTR__ReportCollector_001287a0;
  std::__cxx11::string::~string((string *)&this->message_);
  Reader::Reporter::~Reporter(&this->super_Reporter);
  return;
}

Assistant:

ReportCollector() : dropped_bytes_(0) {}